

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::TextureSpecificationTests::init
          (TextureSpecificationTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  TestCaseGroup *pTVar2;
  undefined8 uVar3;
  int iVar4;
  int extraout_EAX;
  TestNode *pTVar5;
  BasicTexImage2DCase *this_00;
  char *pcVar6;
  BasicTexImageCubeCase *this_01;
  RandomOrderTexImage2DCase *this_02;
  RandomOrderTexImageCubeCase *this_03;
  TexImage2DAlignCase *pTVar7;
  TexImageCubeAlignCase *pTVar8;
  BasicTexSubImage2DCase *this_04;
  BasicTexSubImageCubeCase *this_05;
  TexSubImage2DEmptyTexCase *this_06;
  TexSubImageCubeEmptyTexCase *this_07;
  TexSubImage2DAlignCase *pTVar9;
  TexSubImageCubeAlignCase *pTVar10;
  BasicCopyTexImage2DCase *pBVar11;
  BasicCopyTexImageCubeCase *pBVar12;
  BasicCopyTexSubImage2DCase *pBVar13;
  BasicCopyTexSubImageCubeCase *pBVar14;
  TestCaseGroup *copyTexSubImageGroup;
  TestCaseGroup *copyTexImageGroup;
  TestCaseGroup *alignGroup_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  undefined1 local_3aa;
  allocator<char> local_3a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  undefined4 local_364;
  undefined4 local_360;
  int texCubeSize_2;
  int tex2DHeight_2;
  int tex2DWidth_2;
  deUint32 dataType_2;
  deUint32 format_2;
  char *fmtName_2;
  TestNode *pTStack_340;
  int formatNdx_4;
  TestCaseGroup *texSubImageEmptyTexGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  undefined1 local_2ea;
  allocator<char> local_2e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  undefined4 local_2a4;
  undefined4 local_2a0;
  int texCubeSize_1;
  int tex2DHeight_1;
  int tex2DWidth_1;
  deUint32 dataType_1;
  deUint32 format_1;
  char *fmtName_1;
  TestNode *pTStack_280;
  int formatNdx_3;
  TestCaseGroup *basicTexSubImageGroup;
  TestCaseGroup *alignGroup;
  string local_268;
  allocator<char> local_241;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  int local_200;
  int local_1fc;
  int size;
  int formatNdx_2;
  int ndx_1;
  allocator<char> local_1c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  int local_188;
  int local_184;
  int height;
  int width;
  int formatNdx_1;
  int ndx;
  Random rnd;
  TestCaseGroup *randomTexImageGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_112;
  allocator<char> local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined4 local_cc;
  undefined4 local_c8;
  int texCubeSize;
  int tex2DHeight;
  int tex2DWidth;
  deUint32 dataType;
  deUint32 format;
  char *fmtName;
  int formatNdx;
  TestNode *local_a0;
  TestCaseGroup *basicTexImageGroup;
  anon_struct_16_3_5cb0d78b texFormats [8];
  TextureSpecificationTests *this_local;
  
  texFormats[6]._8_8_ = anon_var_dwarf_27824;
  texFormats[7].name = (char *)0x140100001908;
  texFormats[5]._8_8_ = anon_var_dwarf_c23caf;
  texFormats[6].name = (char *)0x803400001908;
  texFormats[4]._8_8_ = anon_var_dwarf_c23ca4;
  texFormats[5].name = (char *)0x803300001908;
  texFormats[3]._8_8_ = anon_var_dwarf_c23c99;
  texFormats[4].name = (char *)0x140100001907;
  texFormats[2]._8_8_ = (long)"tex_subimage_rgb565" + 0xd;
  texFormats[3].name = (char *)0x836300001907;
  texFormats[1]._8_8_ = anon_var_dwarf_e3b6c6;
  texFormats[2].name = (char *)0x14010000190a;
  texFormats[0]._8_8_ = (long)"depth24_stencil8" + 0xe;
  texFormats[1].name = (char *)0x140100001909;
  basicTexImageGroup = (TestCaseGroup *)0x2b687ba;
  texFormats[0].name = (char *)0x140100001906;
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "basic_teximage2d","Basic glTexImage2D() usage");
  local_a0 = pTVar5;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  for (fmtName._0_4_ = 0; pTVar5 = local_a0, (int)fmtName < 8; fmtName._0_4_ = (int)fmtName + 1) {
    _dataType = *(char **)&texFormats[(long)(int)fmtName + -1].format;
    tex2DWidth = *(int *)&texFormats[(int)fmtName].name;
    tex2DHeight = *(int *)((long)&texFormats[(int)fmtName].name + 4);
    texCubeSize = 0x40;
    local_c8 = 0x80;
    local_cc = 0x40;
    this_00 = (BasicTexImage2DCase *)operator_new(0xa08);
    pcVar6 = _dataType;
    local_112 = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,pcVar6,&local_111);
    std::operator+(&local_f0,&local_110,"_2d");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    BasicTexImage2DCase::BasicTexImage2DCase
              (this_00,pCVar1,pcVar6,"",tex2DWidth,tex2DHeight,1,0x40,0x80);
    local_112 = 0;
    tcu::TestNode::addChild(pTVar5,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
    pTVar5 = local_a0;
    this_01 = (BasicTexImageCubeCase *)operator_new(0xa08);
    pcVar6 = _dataType;
    randomTexImageGroup._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,pcVar6,(allocator<char> *)((long)&randomTexImageGroup + 7));
    std::operator+(&local_138,&local_158,"_cube");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    BasicTexImageCubeCase::BasicTexImageCubeCase
              (this_01,pCVar1,pcVar6,"",tex2DWidth,tex2DHeight,1,0x40,0x40);
    randomTexImageGroup._6_1_ = 0;
    tcu::TestNode::addChild(pTVar5,(TestNode *)this_01);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator((allocator<char> *)((long)&randomTexImageGroup + 7));
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "random_teximage2d","Randomized glTexImage2D() usage");
  rnd.m_rnd._8_8_ = pTVar5;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  de::Random::Random((Random *)&formatNdx_1,9);
  for (width = 0; width < 10; width = width + 1) {
    height = de::Random::getInt((Random *)&formatNdx_1,0,7);
    iVar4 = de::Random::getInt((Random *)&formatNdx_1,2,8);
    local_184 = 1 << ((byte)iVar4 & 0x1f);
    iVar4 = de::Random::getInt((Random *)&formatNdx_1,2,8);
    uVar3 = rnd.m_rnd._8_8_;
    local_188 = 1 << ((byte)iVar4 & 0x1f);
    this_02 = (RandomOrderTexImage2DCase *)operator_new(0xa08);
    formatNdx_2._3_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"2d_",&local_1c9);
    de::toString<int>((string *)&ndx_1,&width);
    std::operator+(&local_1a8,&local_1c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ndx_1);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    RandomOrderTexImage2DCase::RandomOrderTexImage2DCase
              (this_02,pCVar1,pcVar6,"",*(deUint32 *)&texFormats[height].name,
               *(deUint32 *)((long)&texFormats[height].name + 4),1,local_184,local_188);
    formatNdx_2._3_1_ = 0;
    tcu::TestNode::addChild((TestNode *)uVar3,(TestNode *)this_02);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&ndx_1);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
  }
  for (size = 0; size < 10; size = size + 1) {
    local_1fc = de::Random::getInt((Random *)&formatNdx_1,0,7);
    iVar4 = de::Random::getInt((Random *)&formatNdx_1,2,8);
    uVar3 = rnd.m_rnd._8_8_;
    local_200 = 1 << ((byte)iVar4 & 0x1f);
    this_03 = (RandomOrderTexImageCubeCase *)operator_new(0xa08);
    alignGroup._7_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"cube_",&local_241);
    de::toString<int>(&local_268,&size);
    std::operator+(&local_220,&local_240,&local_268);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    RandomOrderTexImageCubeCase::RandomOrderTexImageCubeCase
              (this_03,pCVar1,pcVar6,"",*(deUint32 *)&texFormats[local_1fc].name,
               *(deUint32 *)((long)&texFormats[local_1fc].name + 4),1,local_200,local_200);
    alignGroup._7_1_ = 0;
    tcu::TestNode::addChild((TestNode *)uVar3,(TestNode *)this_03);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator(&local_241);
  }
  de::Random::~Random((Random *)&formatNdx_1);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "teximage2d_align","glTexImage2D() unpack alignment tests");
  basicTexSubImageGroup = (TestCaseGroup *)pTVar5;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar2 = basicTexSubImageGroup;
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(this->super_TestCaseGroup).m_context,"2d_l8_4_8","",0x1909,0x1401,1,4,8,8);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar7);
  pTVar2 = basicTexSubImageGroup;
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(this->super_TestCaseGroup).m_context,"2d_l8_63_1","",0x1909,0x1401,0,0x3f,0x1e,
             1);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar7);
  pTVar2 = basicTexSubImageGroup;
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(this->super_TestCaseGroup).m_context,"2d_l8_63_2","",0x1909,0x1401,0,0x3f,0x1e,
             2);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar7);
  pTVar2 = basicTexSubImageGroup;
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(this->super_TestCaseGroup).m_context,"2d_l8_63_4","",0x1909,0x1401,0,0x3f,0x1e,
             4);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar7);
  pTVar2 = basicTexSubImageGroup;
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(this->super_TestCaseGroup).m_context,"2d_l8_63_8","",0x1909,0x1401,0,0x3f,0x1e,
             8);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar7);
  pTVar2 = basicTexSubImageGroup;
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(this->super_TestCaseGroup).m_context,"2d_rgba4444_51_1","",0x1908,0x8033,0,0x33
             ,0x1e,1);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar7);
  pTVar2 = basicTexSubImageGroup;
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(this->super_TestCaseGroup).m_context,"2d_rgba4444_51_2","",0x1908,0x8033,0,0x33
             ,0x1e,2);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar7);
  pTVar2 = basicTexSubImageGroup;
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(this->super_TestCaseGroup).m_context,"2d_rgba4444_51_4","",0x1908,0x8033,0,0x33
             ,0x1e,4);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar7);
  pTVar2 = basicTexSubImageGroup;
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(this->super_TestCaseGroup).m_context,"2d_rgba4444_51_8","",0x1908,0x8033,0,0x33
             ,0x1e,8);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar7);
  pTVar2 = basicTexSubImageGroup;
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(this->super_TestCaseGroup).m_context,"2d_rgb888_39_1","",0x1907,0x1401,0,0x27,
             0x2b,1);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar7);
  pTVar2 = basicTexSubImageGroup;
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(this->super_TestCaseGroup).m_context,"2d_rgb888_39_2","",0x1907,0x1401,0,0x27,
             0x2b,2);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar7);
  pTVar2 = basicTexSubImageGroup;
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(this->super_TestCaseGroup).m_context,"2d_rgb888_39_4","",0x1907,0x1401,0,0x27,
             0x2b,4);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar7);
  pTVar2 = basicTexSubImageGroup;
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(this->super_TestCaseGroup).m_context,"2d_rgb888_39_8","",0x1907,0x1401,0,0x27,
             0x2b,8);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar7);
  pTVar2 = basicTexSubImageGroup;
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(this->super_TestCaseGroup).m_context,"2d_rgba8888_47_1","",0x1908,0x1401,0,0x2f
             ,0x1b,1);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar7);
  pTVar2 = basicTexSubImageGroup;
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(this->super_TestCaseGroup).m_context,"2d_rgba8888_47_2","",0x1908,0x1401,0,0x2f
             ,0x1b,2);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar7);
  pTVar2 = basicTexSubImageGroup;
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(this->super_TestCaseGroup).m_context,"2d_rgba8888_47_4","",0x1908,0x1401,0,0x2f
             ,0x1b,4);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar7);
  pTVar2 = basicTexSubImageGroup;
  pTVar7 = (TexImage2DAlignCase *)operator_new(0xa10);
  TexImage2DAlignCase::TexImage2DAlignCase
            (pTVar7,(this->super_TestCaseGroup).m_context,"2d_rgba8888_47_8","",0x1908,0x1401,0,0x2f
             ,0x1b,8);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar7);
  pTVar2 = basicTexSubImageGroup;
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(this->super_TestCaseGroup).m_context,"cube_l8_4_8","",0x1909,0x1401,1,4,4,8);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar8);
  pTVar2 = basicTexSubImageGroup;
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(this->super_TestCaseGroup).m_context,"cube_l8_63_1","",0x1909,0x1401,0,0x3f,
             0x3f,1);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar8);
  pTVar2 = basicTexSubImageGroup;
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(this->super_TestCaseGroup).m_context,"cube_l8_63_2","",0x1909,0x1401,0,0x3f,
             0x3f,2);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar8);
  pTVar2 = basicTexSubImageGroup;
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(this->super_TestCaseGroup).m_context,"cube_l8_63_4","",0x1909,0x1401,0,0x3f,
             0x3f,4);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar8);
  pTVar2 = basicTexSubImageGroup;
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(this->super_TestCaseGroup).m_context,"cube_l8_63_8","",0x1909,0x1401,0,0x3f,
             0x3f,8);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar8);
  pTVar2 = basicTexSubImageGroup;
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(this->super_TestCaseGroup).m_context,"cube_rgba4444_51_1","",0x1908,0x8033,0,
             0x33,0x33,1);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar8);
  pTVar2 = basicTexSubImageGroup;
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(this->super_TestCaseGroup).m_context,"cube_rgba4444_51_2","",0x1908,0x8033,0,
             0x33,0x33,2);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar8);
  pTVar2 = basicTexSubImageGroup;
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(this->super_TestCaseGroup).m_context,"cube_rgba4444_51_4","",0x1908,0x8033,0,
             0x33,0x33,4);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar8);
  pTVar2 = basicTexSubImageGroup;
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(this->super_TestCaseGroup).m_context,"cube_rgba4444_51_8","",0x1908,0x8033,0,
             0x33,0x33,8);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar8);
  pTVar2 = basicTexSubImageGroup;
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(this->super_TestCaseGroup).m_context,"cube_rgb888_39_1","",0x1907,0x1401,0,0x27
             ,0x27,1);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar8);
  pTVar2 = basicTexSubImageGroup;
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(this->super_TestCaseGroup).m_context,"cube_rgb888_39_2","",0x1907,0x1401,0,0x27
             ,0x27,2);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar8);
  pTVar2 = basicTexSubImageGroup;
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(this->super_TestCaseGroup).m_context,"cube_rgb888_39_4","",0x1907,0x1401,0,0x27
             ,0x27,4);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar8);
  pTVar2 = basicTexSubImageGroup;
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(this->super_TestCaseGroup).m_context,"cube_rgb888_39_8","",0x1907,0x1401,0,0x27
             ,0x27,8);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar8);
  pTVar2 = basicTexSubImageGroup;
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(this->super_TestCaseGroup).m_context,"cube_rgba8888_47_1","",0x1908,0x1401,0,
             0x2f,0x2f,1);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar8);
  pTVar2 = basicTexSubImageGroup;
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(this->super_TestCaseGroup).m_context,"cube_rgba8888_47_2","",0x1908,0x1401,0,
             0x2f,0x2f,2);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar8);
  pTVar2 = basicTexSubImageGroup;
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(this->super_TestCaseGroup).m_context,"cube_rgba8888_47_4","",0x1908,0x1401,0,
             0x2f,0x2f,4);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar8);
  pTVar2 = basicTexSubImageGroup;
  pTVar8 = (TexImageCubeAlignCase *)operator_new(0xa10);
  TexImageCubeAlignCase::TexImageCubeAlignCase
            (pTVar8,(this->super_TestCaseGroup).m_context,"cube_rgba8888_47_8","",0x1908,0x1401,0,
             0x2f,0x2f,8);
  tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pTVar8);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "basic_texsubimage2d","Basic glTexSubImage2D() usage");
  pTStack_280 = pTVar5;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  for (fmtName_1._4_4_ = 0; pTVar5 = pTStack_280, fmtName_1._4_4_ < 8;
      fmtName_1._4_4_ = fmtName_1._4_4_ + 1) {
    _dataType_1 = *(char **)&texFormats[(long)fmtName_1._4_4_ + -1].format;
    tex2DWidth_1 = *(int *)&texFormats[fmtName_1._4_4_].name;
    tex2DHeight_1 = *(int *)((long)&texFormats[fmtName_1._4_4_].name + 4);
    texCubeSize_1 = 0x40;
    local_2a0 = 0x80;
    local_2a4 = 0x40;
    this_04 = (BasicTexSubImage2DCase *)operator_new(0xa08);
    pcVar6 = _dataType_1;
    local_2ea = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,pcVar6,&local_2e9);
    std::operator+(&local_2c8,&local_2e8,"_2d");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    BasicTexSubImage2DCase::BasicTexSubImage2DCase
              (this_04,pCVar1,pcVar6,"",tex2DWidth_1,tex2DHeight_1,1,0x40,0x80);
    local_2ea = 0;
    tcu::TestNode::addChild(pTVar5,(TestNode *)this_04);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator(&local_2e9);
    pTVar5 = pTStack_280;
    this_05 = (BasicTexSubImageCubeCase *)operator_new(0xa08);
    pcVar6 = _dataType_1;
    texSubImageEmptyTexGroup._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_330,pcVar6,(allocator<char> *)((long)&texSubImageEmptyTexGroup + 7))
    ;
    std::operator+(&local_310,&local_330,"_cube");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    BasicTexSubImageCubeCase::BasicTexSubImageCubeCase
              (this_05,pCVar1,pcVar6,"",tex2DWidth_1,tex2DHeight_1,1,0x40,0x40);
    texSubImageEmptyTexGroup._6_1_ = 0;
    tcu::TestNode::addChild(pTVar5,(TestNode *)this_05);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_330);
    std::allocator<char>::~allocator((allocator<char> *)((long)&texSubImageEmptyTexGroup + 7));
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "texsubimage2d_empty_tex","glTexSubImage2D() to texture that has storage but no data");
  pTStack_340 = pTVar5;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  for (fmtName_2._4_4_ = 0; pTVar5 = pTStack_340, fmtName_2._4_4_ < 8;
      fmtName_2._4_4_ = fmtName_2._4_4_ + 1) {
    _dataType_2 = *(char **)&texFormats[(long)fmtName_2._4_4_ + -1].format;
    tex2DWidth_2 = *(int *)&texFormats[fmtName_2._4_4_].name;
    tex2DHeight_2 = *(int *)((long)&texFormats[fmtName_2._4_4_].name + 4);
    texCubeSize_2 = 0x40;
    local_360 = 0x20;
    local_364 = 0x20;
    this_06 = (TexSubImage2DEmptyTexCase *)operator_new(0xa08);
    pcVar6 = _dataType_2;
    local_3aa = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,pcVar6,&local_3a9);
    std::operator+(&local_388,&local_3a8,"_2d");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    TexSubImage2DEmptyTexCase::TexSubImage2DEmptyTexCase
              (this_06,pCVar1,pcVar6,"",tex2DWidth_2,tex2DHeight_2,1,0x40,0x20);
    local_3aa = 0;
    tcu::TestNode::addChild(pTVar5,(TestNode *)this_06);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::allocator<char>::~allocator(&local_3a9);
    pTVar5 = pTStack_340;
    this_07 = (TexSubImageCubeEmptyTexCase *)operator_new(0xa08);
    pcVar6 = _dataType_2;
    alignGroup_1._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f0,pcVar6,(allocator<char> *)((long)&alignGroup_1 + 7));
    std::operator+(&local_3d0,&local_3f0,"_cube");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    TexSubImageCubeEmptyTexCase::TexSubImageCubeEmptyTexCase
              (this_07,pCVar1,pcVar6,"",tex2DWidth_2,tex2DHeight_2,1,0x20,0x20);
    alignGroup_1._6_1_ = 0;
    tcu::TestNode::addChild(pTVar5,(TestNode *)this_07);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&alignGroup_1 + 7));
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "texsubimage2d_align","glTexSubImage2D() unpack alignment tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(this->super_TestCaseGroup).m_context,"2d_l8_1_1","",0x1909,0x1401,0x40,0x40,0xd
             ,0x11,1,6,1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(this->super_TestCaseGroup).m_context,"2d_l8_1_2","",0x1909,0x1401,0x40,0x40,0xd
             ,0x11,1,6,2);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(this->super_TestCaseGroup).m_context,"2d_l8_1_4","",0x1909,0x1401,0x40,0x40,0xd
             ,0x11,1,6,4);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(this->super_TestCaseGroup).m_context,"2d_l8_1_8","",0x1909,0x1401,0x40,0x40,0xd
             ,0x11,1,6,8);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(this->super_TestCaseGroup).m_context,"2d_l8_63_1","",0x1909,0x1401,0x40,0x40,1,
             9,0x3f,0x1e,1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(this->super_TestCaseGroup).m_context,"2d_l8_63_2","",0x1909,0x1401,0x40,0x40,1,
             9,0x3f,0x1e,2);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(this->super_TestCaseGroup).m_context,"2d_l8_63_4","",0x1909,0x1401,0x40,0x40,1,
             9,0x3f,0x1e,4);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(this->super_TestCaseGroup).m_context,"2d_l8_63_8","",0x1909,0x1401,0x40,0x40,1,
             9,0x3f,0x1e,8);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(this->super_TestCaseGroup).m_context,"2d_rgba4444_51_1","",0x1908,0x8033,0x40,
             0x40,7,0x1d,0x33,0x1e,1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(this->super_TestCaseGroup).m_context,"2d_rgba4444_51_2","",0x1908,0x8033,0x40,
             0x40,7,0x1d,0x33,0x1e,2);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(this->super_TestCaseGroup).m_context,"2d_rgba4444_51_4","",0x1908,0x8033,0x40,
             0x40,7,0x1d,0x33,0x1e,4);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(this->super_TestCaseGroup).m_context,"2d_rgba4444_51_8","",0x1908,0x8033,0x40,
             0x40,7,0x1d,0x33,0x1e,8);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(this->super_TestCaseGroup).m_context,"2d_rgb888_39_1","",0x1907,0x1401,0x40,
             0x40,0xb,8,0x27,0x2b,1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(this->super_TestCaseGroup).m_context,"2d_rgb888_39_2","",0x1907,0x1401,0x40,
             0x40,0xb,8,0x27,0x2b,2);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(this->super_TestCaseGroup).m_context,"2d_rgb888_39_4","",0x1907,0x1401,0x40,
             0x40,0xb,8,0x27,0x2b,4);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(this->super_TestCaseGroup).m_context,"2d_rgb888_39_8","",0x1907,0x1401,0x40,
             0x40,0xb,8,0x27,0x2b,8);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(this->super_TestCaseGroup).m_context,"2d_rgba8888_47_1","",0x1908,0x1401,0x40,
             0x40,10,1,0x2f,0x1b,1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(this->super_TestCaseGroup).m_context,"2d_rgba8888_47_2","",0x1908,0x1401,0x40,
             0x40,10,1,0x2f,0x1b,2);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(this->super_TestCaseGroup).m_context,"2d_rgba8888_47_4","",0x1908,0x1401,0x40,
             0x40,10,1,0x2f,0x1b,4);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar9);
  pTVar9 = (TexSubImage2DAlignCase *)operator_new(0xa20);
  TexSubImage2DAlignCase::TexSubImage2DAlignCase
            (pTVar9,(this->super_TestCaseGroup).m_context,"2d_rgba8888_47_8","",0x1908,0x1401,0x40,
             0x40,10,1,0x2f,0x1b,8);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar9);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(this->super_TestCaseGroup).m_context,"cube_l8_1_1","",0x1909,0x1401,0x40,0x40,
             0xd,0x11,1,6,1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(this->super_TestCaseGroup).m_context,"cube_l8_1_2","",0x1909,0x1401,0x40,0x40,
             0xd,0x11,1,6,2);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(this->super_TestCaseGroup).m_context,"cube_l8_1_4","",0x1909,0x1401,0x40,0x40,
             0xd,0x11,1,6,4);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(this->super_TestCaseGroup).m_context,"cube_l8_1_8","",0x1909,0x1401,0x40,0x40,
             0xd,0x11,1,6,8);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(this->super_TestCaseGroup).m_context,"cube_l8_63_1","",0x1909,0x1401,0x40,0x40
             ,1,9,0x3f,0x1e,1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(this->super_TestCaseGroup).m_context,"cube_l8_63_2","",0x1909,0x1401,0x40,0x40
             ,1,9,0x3f,0x1e,2);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(this->super_TestCaseGroup).m_context,"cube_l8_63_4","",0x1909,0x1401,0x40,0x40
             ,1,9,0x3f,0x1e,4);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(this->super_TestCaseGroup).m_context,"cube_l8_63_8","",0x1909,0x1401,0x40,0x40
             ,1,9,0x3f,0x1e,8);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(this->super_TestCaseGroup).m_context,"cube_rgba4444_51_1","",0x1908,0x8033,
             0x40,0x40,7,0x1d,0x33,0x1e,1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(this->super_TestCaseGroup).m_context,"cube_rgba4444_51_2","",0x1908,0x8033,
             0x40,0x40,7,0x1d,0x33,0x1e,2);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(this->super_TestCaseGroup).m_context,"cube_rgba4444_51_4","",0x1908,0x8033,
             0x40,0x40,7,0x1d,0x33,0x1e,4);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(this->super_TestCaseGroup).m_context,"cube_rgba4444_51_8","",0x1908,0x8033,
             0x40,0x40,7,0x1d,0x33,0x1e,8);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(this->super_TestCaseGroup).m_context,"cube_rgb888_39_1","",0x1907,0x1401,0x40,
             0x40,0xb,8,0x27,0x2b,1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(this->super_TestCaseGroup).m_context,"cube_rgb888_39_2","",0x1907,0x1401,0x40,
             0x40,0xb,8,0x27,0x2b,2);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(this->super_TestCaseGroup).m_context,"cube_rgb888_39_4","",0x1907,0x1401,0x40,
             0x40,0xb,8,0x27,0x2b,4);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(this->super_TestCaseGroup).m_context,"cube_rgb888_39_8","",0x1907,0x1401,0x40,
             0x40,0xb,8,0x27,0x2b,8);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(this->super_TestCaseGroup).m_context,"cube_rgba8888_47_1","",0x1908,0x1401,
             0x40,0x40,10,1,0x2f,0x1b,1);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(this->super_TestCaseGroup).m_context,"cube_rgba8888_47_2","",0x1908,0x1401,
             0x40,0x40,10,1,0x2f,0x1b,2);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(this->super_TestCaseGroup).m_context,"cube_rgba8888_47_4","",0x1908,0x1401,
             0x40,0x40,10,1,0x2f,0x1b,4);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar10);
  pTVar10 = (TexSubImageCubeAlignCase *)operator_new(0xa20);
  TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
            (pTVar10,(this->super_TestCaseGroup).m_context,"cube_rgba8888_47_8","",0x1908,0x1401,
             0x40,0x40,10,1,0x2f,0x1b,8);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar10);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "basic_copyteximage2d","Basic glCopyTexImage2D() usage");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pBVar11 = (BasicCopyTexImage2DCase *)operator_new(0xa08);
  BasicCopyTexImage2DCase::BasicCopyTexImage2DCase
            (pBVar11,(this->super_TestCaseGroup).m_context,"2d_alpha","",0x1906,1,0x80,0x40);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar11);
  pBVar11 = (BasicCopyTexImage2DCase *)operator_new(0xa08);
  BasicCopyTexImage2DCase::BasicCopyTexImage2DCase
            (pBVar11,(this->super_TestCaseGroup).m_context,"2d_luminance","",0x1909,1,0x80,0x40);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar11);
  pBVar11 = (BasicCopyTexImage2DCase *)operator_new(0xa08);
  BasicCopyTexImage2DCase::BasicCopyTexImage2DCase
            (pBVar11,(this->super_TestCaseGroup).m_context,"2d_luminance_alpha","",0x190a,1,0x80,
             0x40);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar11);
  pBVar11 = (BasicCopyTexImage2DCase *)operator_new(0xa08);
  BasicCopyTexImage2DCase::BasicCopyTexImage2DCase
            (pBVar11,(this->super_TestCaseGroup).m_context,"2d_rgb","",0x1907,1,0x80,0x40);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar11);
  pBVar11 = (BasicCopyTexImage2DCase *)operator_new(0xa08);
  BasicCopyTexImage2DCase::BasicCopyTexImage2DCase
            (pBVar11,(this->super_TestCaseGroup).m_context,"2d_rgba","",0x1908,1,0x80,0x40);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar11);
  pBVar12 = (BasicCopyTexImageCubeCase *)operator_new(0xa08);
  BasicCopyTexImageCubeCase::BasicCopyTexImageCubeCase
            (pBVar12,(this->super_TestCaseGroup).m_context,"cube_alpha","",0x1906,1,0x40,0x40);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar12);
  pBVar12 = (BasicCopyTexImageCubeCase *)operator_new(0xa08);
  BasicCopyTexImageCubeCase::BasicCopyTexImageCubeCase
            (pBVar12,(this->super_TestCaseGroup).m_context,"cube_luminance","",0x1909,1,0x40,0x40);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar12);
  pBVar12 = (BasicCopyTexImageCubeCase *)operator_new(0xa08);
  BasicCopyTexImageCubeCase::BasicCopyTexImageCubeCase
            (pBVar12,(this->super_TestCaseGroup).m_context,"cube_luminance_alpha","",0x190a,1,0x40,
             0x40);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar12);
  pBVar12 = (BasicCopyTexImageCubeCase *)operator_new(0xa08);
  BasicCopyTexImageCubeCase::BasicCopyTexImageCubeCase
            (pBVar12,(this->super_TestCaseGroup).m_context,"cube_rgb","",0x1907,1,0x40,0x40);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar12);
  pBVar12 = (BasicCopyTexImageCubeCase *)operator_new(0xa08);
  BasicCopyTexImageCubeCase::BasicCopyTexImageCubeCase
            (pBVar12,(this->super_TestCaseGroup).m_context,"cube_rgba","",0x1908,1,0x40,0x40);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar12);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "basic_copytexsubimage2d","Basic glCopyTexSubImage2D() usage");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pBVar13 = (BasicCopyTexSubImage2DCase *)operator_new(0xa08);
  BasicCopyTexSubImage2DCase::BasicCopyTexSubImage2DCase
            (pBVar13,(this->super_TestCaseGroup).m_context,"2d_alpha","",0x1906,0x1401,1,0x80,0x40);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar13);
  pBVar13 = (BasicCopyTexSubImage2DCase *)operator_new(0xa08);
  BasicCopyTexSubImage2DCase::BasicCopyTexSubImage2DCase
            (pBVar13,(this->super_TestCaseGroup).m_context,"2d_luminance","",0x1909,0x1401,1,0x80,
             0x40);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar13);
  pBVar13 = (BasicCopyTexSubImage2DCase *)operator_new(0xa08);
  BasicCopyTexSubImage2DCase::BasicCopyTexSubImage2DCase
            (pBVar13,(this->super_TestCaseGroup).m_context,"2d_luminance_alpha","",0x190a,0x1401,1,
             0x80,0x40);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar13);
  pBVar13 = (BasicCopyTexSubImage2DCase *)operator_new(0xa08);
  BasicCopyTexSubImage2DCase::BasicCopyTexSubImage2DCase
            (pBVar13,(this->super_TestCaseGroup).m_context,"2d_rgb","",0x1907,0x1401,1,0x80,0x40);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar13);
  pBVar13 = (BasicCopyTexSubImage2DCase *)operator_new(0xa08);
  BasicCopyTexSubImage2DCase::BasicCopyTexSubImage2DCase
            (pBVar13,(this->super_TestCaseGroup).m_context,"2d_rgba","",0x1908,0x1401,1,0x80,0x40);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar13);
  pBVar14 = (BasicCopyTexSubImageCubeCase *)operator_new(0xa08);
  BasicCopyTexSubImageCubeCase::BasicCopyTexSubImageCubeCase
            (pBVar14,(this->super_TestCaseGroup).m_context,"cube_alpha","",0x1906,0x1401,1,0x40,0x40
            );
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar14);
  pBVar14 = (BasicCopyTexSubImageCubeCase *)operator_new(0xa08);
  BasicCopyTexSubImageCubeCase::BasicCopyTexSubImageCubeCase
            (pBVar14,(this->super_TestCaseGroup).m_context,"cube_luminance","",0x1909,0x1401,1,0x40,
             0x40);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar14);
  pBVar14 = (BasicCopyTexSubImageCubeCase *)operator_new(0xa08);
  BasicCopyTexSubImageCubeCase::BasicCopyTexSubImageCubeCase
            (pBVar14,(this->super_TestCaseGroup).m_context,"cube_luminance_alpha","",0x190a,0x1401,1
             ,0x40,0x40);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar14);
  pBVar14 = (BasicCopyTexSubImageCubeCase *)operator_new(0xa08);
  BasicCopyTexSubImageCubeCase::BasicCopyTexSubImageCubeCase
            (pBVar14,(this->super_TestCaseGroup).m_context,"cube_rgb","",0x1907,0x1401,1,0x40,0x40);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar14);
  pBVar14 = (BasicCopyTexSubImageCubeCase *)operator_new(0xa08);
  BasicCopyTexSubImageCubeCase::BasicCopyTexSubImageCubeCase
            (pBVar14,(this->super_TestCaseGroup).m_context,"cube_rgba","",0x1908,0x1401,1,0x40,0x40)
  ;
  tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar14);
  return extraout_EAX;
}

Assistant:

void TextureSpecificationTests::init (void)
{
	struct
	{
		const char*	name;
		deUint32	format;
		deUint32	dataType;
	} texFormats[] =
	{
		{ "a8",			GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "l8",			GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "la88",		GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE },
		{ "rgb565",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgb888",		GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba4444",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgba5551",	GL_RGBA,			GL_UNSIGNED_SHORT_5_5_5_1 },
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE }
	};

	// Basic TexImage2D usage.
	{
		tcu::TestCaseGroup* basicTexImageGroup = new tcu::TestCaseGroup(m_testCtx, "basic_teximage2d", "Basic glTexImage2D() usage");
		addChild(basicTexImageGroup);
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
		{
			const char*	fmtName		= texFormats[formatNdx].name;
			deUint32	format		= texFormats[formatNdx].format;
			deUint32	dataType	= texFormats[formatNdx].dataType;
			const int	tex2DWidth	= 64;
			const int	tex2DHeight	= 128;
			const int	texCubeSize	= 64;

			basicTexImageGroup->addChild(new BasicTexImage2DCase	(m_context,	(string(fmtName) + "_2d").c_str(),		"",	format, dataType, MIPMAPS, tex2DWidth, tex2DHeight));
			basicTexImageGroup->addChild(new BasicTexImageCubeCase	(m_context,	(string(fmtName) + "_cube").c_str(),	"",	format, dataType, MIPMAPS, texCubeSize, texCubeSize));
		}
	}

	// Randomized TexImage2D order.
	{
		tcu::TestCaseGroup* randomTexImageGroup = new tcu::TestCaseGroup(m_testCtx, "random_teximage2d", "Randomized glTexImage2D() usage");
		addChild(randomTexImageGroup);

		de::Random rnd(9);

		// 2D cases.
		for (int ndx = 0; ndx < 10; ndx++)
		{
			int		formatNdx	= rnd.getInt(0, DE_LENGTH_OF_ARRAY(texFormats)-1);
			int		width		= 1 << rnd.getInt(2, 8);
			int		height		= 1 << rnd.getInt(2, 8);

			randomTexImageGroup->addChild(new RandomOrderTexImage2DCase(m_context, (string("2d_") + de::toString(ndx)).c_str(), "", texFormats[formatNdx].format, texFormats[formatNdx].dataType, MIPMAPS, width, height));
		}

		// Cubemap cases.
		for (int ndx = 0; ndx < 10; ndx++)
		{
			int		formatNdx	= rnd.getInt(0, DE_LENGTH_OF_ARRAY(texFormats)-1);
			int		size		= 1 << rnd.getInt(2, 8);

			randomTexImageGroup->addChild(new RandomOrderTexImageCubeCase(m_context, (string("cube_") + de::toString(ndx)).c_str(), "", texFormats[formatNdx].format, texFormats[formatNdx].dataType, MIPMAPS, size, size));
		}
	}

	// TexImage2D unpack alignment.
	{
		tcu::TestCaseGroup* alignGroup = new tcu::TestCaseGroup(m_testCtx, "teximage2d_align", "glTexImage2D() unpack alignment tests");
		addChild(alignGroup);

		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_l8_4_8",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			MIPMAPS,	 4, 8, 8));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_l8_63_1",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			0,			63, 30, 1));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_l8_63_2",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			0,			63, 30, 2));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_l8_63_4",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			0,			63, 30, 4));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_l8_63_8",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			0,			63, 30, 8));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgba4444_51_1",		"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	0,			51, 30, 1));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgba4444_51_2",		"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	0,			51, 30, 2));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgba4444_51_4",		"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	0,			51, 30, 4));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgba4444_51_8",		"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	0,			51, 30, 8));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgb888_39_1",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			0,			39, 43, 1));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgb888_39_2",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			0,			39, 43, 2));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgb888_39_4",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			0,			39, 43, 4));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgb888_39_8",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			0,			39, 43, 8));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgba8888_47_1",		"",	GL_RGBA,		GL_UNSIGNED_BYTE,			0,			47, 27, 1));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgba8888_47_2",		"",	GL_RGBA,		GL_UNSIGNED_BYTE,			0,			47, 27, 2));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgba8888_47_4",		"",	GL_RGBA,		GL_UNSIGNED_BYTE,			0,			47, 27, 4));
		alignGroup->addChild(new TexImage2DAlignCase	(m_context, "2d_rgba8888_47_8",		"",	GL_RGBA,		GL_UNSIGNED_BYTE,			0,			47, 27, 8));

		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_l8_4_8",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			MIPMAPS,	 4, 4, 8));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_l8_63_1",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			0,			63, 63, 1));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_l8_63_2",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			0,			63, 63, 2));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_l8_63_4",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			0,			63, 63, 4));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_l8_63_8",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			0,			63, 63, 8));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgba4444_51_1",	"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	0,			51, 51, 1));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgba4444_51_2",	"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	0,			51, 51, 2));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgba4444_51_4",	"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	0,			51, 51, 4));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgba4444_51_8",	"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	0,			51, 51, 8));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgb888_39_1",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			0,			39, 39, 1));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgb888_39_2",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			0,			39, 39, 2));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgb888_39_4",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			0,			39, 39, 4));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgb888_39_8",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			0,			39, 39, 8));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgba8888_47_1",	"",	GL_RGBA,		GL_UNSIGNED_BYTE,			0,			47, 47, 1));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgba8888_47_2",	"",	GL_RGBA,		GL_UNSIGNED_BYTE,			0,			47, 47, 2));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgba8888_47_4",	"",	GL_RGBA,		GL_UNSIGNED_BYTE,			0,			47, 47, 4));
		alignGroup->addChild(new TexImageCubeAlignCase	(m_context, "cube_rgba8888_47_8",	"",	GL_RGBA,		GL_UNSIGNED_BYTE,			0,			47, 47, 8));
	}

	// Basic TexSubImage2D usage.
	{
		tcu::TestCaseGroup* basicTexSubImageGroup = new tcu::TestCaseGroup(m_testCtx, "basic_texsubimage2d", "Basic glTexSubImage2D() usage");
		addChild(basicTexSubImageGroup);
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
		{
			const char*	fmtName		= texFormats[formatNdx].name;
			deUint32	format		= texFormats[formatNdx].format;
			deUint32	dataType	= texFormats[formatNdx].dataType;
			const int	tex2DWidth	= 64;
			const int	tex2DHeight	= 128;
			const int	texCubeSize	= 64;

			basicTexSubImageGroup->addChild(new BasicTexSubImage2DCase		(m_context,	(string(fmtName) + "_2d").c_str(),		"",	format, dataType, MIPMAPS, tex2DWidth, tex2DHeight));
			basicTexSubImageGroup->addChild(new BasicTexSubImageCubeCase	(m_context,	(string(fmtName) + "_cube").c_str(),	"",	format, dataType, MIPMAPS, texCubeSize, texCubeSize));
		}
	}

	// TexSubImage2D to empty texture.
	{
		tcu::TestCaseGroup* texSubImageEmptyTexGroup = new tcu::TestCaseGroup(m_testCtx, "texsubimage2d_empty_tex", "glTexSubImage2D() to texture that has storage but no data");
		addChild(texSubImageEmptyTexGroup);
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
		{
			const char*	fmtName		= texFormats[formatNdx].name;
			deUint32	format		= texFormats[formatNdx].format;
			deUint32	dataType	= texFormats[formatNdx].dataType;
			const int	tex2DWidth	= 64;
			const int	tex2DHeight	= 32;
			const int	texCubeSize	= 32;

			texSubImageEmptyTexGroup->addChild(new TexSubImage2DEmptyTexCase	(m_context,	(string(fmtName) + "_2d").c_str(),		"",	format, dataType, MIPMAPS, tex2DWidth, tex2DHeight));
			texSubImageEmptyTexGroup->addChild(new TexSubImageCubeEmptyTexCase	(m_context,	(string(fmtName) + "_cube").c_str(),	"",	format, dataType, MIPMAPS, texCubeSize, texCubeSize));
		}
	}

	// TexSubImage2D alignment cases.
	{
		tcu::TestCaseGroup* alignGroup = new tcu::TestCaseGroup(m_testCtx, "texsubimage2d_align", "glTexSubImage2D() unpack alignment tests");
		addChild(alignGroup);

		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_l8_1_1",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64, 13, 17,  1,  6, 1));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_l8_1_2",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64, 13, 17,  1,  6, 2));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_l8_1_4",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64, 13, 17,  1,  6, 4));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_l8_1_8",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64, 13, 17,  1,  6, 8));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_l8_63_1",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64,  1,  9, 63, 30, 1));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_l8_63_2",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64,  1,  9, 63, 30, 2));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_l8_63_4",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64,  1,  9, 63, 30, 4));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_l8_63_8",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64,  1,  9, 63, 30, 8));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgba4444_51_1",		"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	64, 64,  7, 29, 51, 30, 1));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgba4444_51_2",		"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	64, 64,  7, 29, 51, 30, 2));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgba4444_51_4",		"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	64, 64,  7, 29, 51, 30, 4));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgba4444_51_8",		"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	64, 64,  7, 29, 51, 30, 8));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgb888_39_1",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			64, 64, 11,  8, 39, 43, 1));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgb888_39_2",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			64, 64, 11,  8, 39, 43, 2));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgb888_39_4",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			64, 64, 11,  8, 39, 43, 4));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgb888_39_8",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			64, 64, 11,  8, 39, 43, 8));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgba8888_47_1",		"",	GL_RGBA,		GL_UNSIGNED_BYTE,			64, 64, 10,  1, 47, 27, 1));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgba8888_47_2",		"",	GL_RGBA,		GL_UNSIGNED_BYTE,			64, 64, 10,  1, 47, 27, 2));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgba8888_47_4",		"",	GL_RGBA,		GL_UNSIGNED_BYTE,			64, 64, 10,  1, 47, 27, 4));
		alignGroup->addChild(new TexSubImage2DAlignCase		(m_context, "2d_rgba8888_47_8",		"",	GL_RGBA,		GL_UNSIGNED_BYTE,			64, 64, 10,  1, 47, 27, 8));

		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_l8_1_1",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64, 13, 17,  1,  6, 1));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_l8_1_2",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64, 13, 17,  1,  6, 2));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_l8_1_4",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64, 13, 17,  1,  6, 4));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_l8_1_8",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64, 13, 17,  1,  6, 8));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_l8_63_1",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64,  1,  9, 63, 30, 1));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_l8_63_2",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64,  1,  9, 63, 30, 2));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_l8_63_4",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64,  1,  9, 63, 30, 4));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_l8_63_8",			"",	GL_LUMINANCE,	GL_UNSIGNED_BYTE,			64, 64,  1,  9, 63, 30, 8));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgba4444_51_1",	"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	64, 64,  7, 29, 51, 30, 1));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgba4444_51_2",	"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	64, 64,  7, 29, 51, 30, 2));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgba4444_51_4",	"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	64, 64,  7, 29, 51, 30, 4));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgba4444_51_8",	"",	GL_RGBA,		GL_UNSIGNED_SHORT_4_4_4_4,	64, 64,  7, 29, 51, 30, 8));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgb888_39_1",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			64, 64, 11,  8, 39, 43, 1));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgb888_39_2",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			64, 64, 11,  8, 39, 43, 2));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgb888_39_4",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			64, 64, 11,  8, 39, 43, 4));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgb888_39_8",		"",	GL_RGB,			GL_UNSIGNED_BYTE,			64, 64, 11,  8, 39, 43, 8));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgba8888_47_1",	"",	GL_RGBA,		GL_UNSIGNED_BYTE,			64, 64, 10,  1, 47, 27, 1));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgba8888_47_2",	"",	GL_RGBA,		GL_UNSIGNED_BYTE,			64, 64, 10,  1, 47, 27, 2));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgba8888_47_4",	"",	GL_RGBA,		GL_UNSIGNED_BYTE,			64, 64, 10,  1, 47, 27, 4));
		alignGroup->addChild(new TexSubImageCubeAlignCase	(m_context, "cube_rgba8888_47_8",	"",	GL_RGBA,		GL_UNSIGNED_BYTE,			64, 64, 10,  1, 47, 27, 8));
	}

	// Basic glCopyTexImage2D() cases
	{
		tcu::TestCaseGroup* copyTexImageGroup = new tcu::TestCaseGroup(m_testCtx, "basic_copyteximage2d", "Basic glCopyTexImage2D() usage");
		addChild(copyTexImageGroup);

		copyTexImageGroup->addChild(new BasicCopyTexImage2DCase		(m_context, "2d_alpha",				"",	GL_ALPHA,			MIPMAPS,	128, 64));
		copyTexImageGroup->addChild(new BasicCopyTexImage2DCase		(m_context, "2d_luminance",			"",	GL_LUMINANCE,		MIPMAPS,	128, 64));
		copyTexImageGroup->addChild(new BasicCopyTexImage2DCase		(m_context, "2d_luminance_alpha",	"",	GL_LUMINANCE_ALPHA,	MIPMAPS,	128, 64));
		copyTexImageGroup->addChild(new BasicCopyTexImage2DCase		(m_context, "2d_rgb",				"",	GL_RGB,				MIPMAPS,	128, 64));
		copyTexImageGroup->addChild(new BasicCopyTexImage2DCase		(m_context, "2d_rgba",				"",	GL_RGBA,			MIPMAPS,	128, 64));

		copyTexImageGroup->addChild(new BasicCopyTexImageCubeCase	(m_context, "cube_alpha",			"",	GL_ALPHA,			MIPMAPS,	64, 64));
		copyTexImageGroup->addChild(new BasicCopyTexImageCubeCase	(m_context, "cube_luminance",		"",	GL_LUMINANCE,		MIPMAPS,	64, 64));
		copyTexImageGroup->addChild(new BasicCopyTexImageCubeCase	(m_context, "cube_luminance_alpha",	"",	GL_LUMINANCE_ALPHA,	MIPMAPS,	64, 64));
		copyTexImageGroup->addChild(new BasicCopyTexImageCubeCase	(m_context, "cube_rgb",				"",	GL_RGB,				MIPMAPS,	64, 64));
		copyTexImageGroup->addChild(new BasicCopyTexImageCubeCase	(m_context, "cube_rgba",			"",	GL_RGBA,			MIPMAPS,	64, 64));
	}

	// Basic glCopyTexSubImage2D() cases
	{
		tcu::TestCaseGroup* copyTexSubImageGroup = new tcu::TestCaseGroup(m_testCtx, "basic_copytexsubimage2d", "Basic glCopyTexSubImage2D() usage");
		addChild(copyTexSubImageGroup);

		copyTexSubImageGroup->addChild(new BasicCopyTexSubImage2DCase	(m_context, "2d_alpha",				"",	GL_ALPHA,			GL_UNSIGNED_BYTE, MIPMAPS, 128, 64));
		copyTexSubImageGroup->addChild(new BasicCopyTexSubImage2DCase	(m_context, "2d_luminance",			"",	GL_LUMINANCE,		GL_UNSIGNED_BYTE, MIPMAPS, 128, 64));
		copyTexSubImageGroup->addChild(new BasicCopyTexSubImage2DCase	(m_context, "2d_luminance_alpha",	"",	GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE, MIPMAPS, 128, 64));
		copyTexSubImageGroup->addChild(new BasicCopyTexSubImage2DCase	(m_context, "2d_rgb",				"",	GL_RGB,				GL_UNSIGNED_BYTE, MIPMAPS, 128, 64));
		copyTexSubImageGroup->addChild(new BasicCopyTexSubImage2DCase	(m_context, "2d_rgba",				"",	GL_RGBA,			GL_UNSIGNED_BYTE, MIPMAPS, 128, 64));

		copyTexSubImageGroup->addChild(new BasicCopyTexSubImageCubeCase	(m_context, "cube_alpha",			"",	GL_ALPHA,			GL_UNSIGNED_BYTE, MIPMAPS, 64, 64));
		copyTexSubImageGroup->addChild(new BasicCopyTexSubImageCubeCase	(m_context, "cube_luminance",		"",	GL_LUMINANCE,		GL_UNSIGNED_BYTE, MIPMAPS, 64, 64));
		copyTexSubImageGroup->addChild(new BasicCopyTexSubImageCubeCase	(m_context, "cube_luminance_alpha",	"",	GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE, MIPMAPS, 64, 64));
		copyTexSubImageGroup->addChild(new BasicCopyTexSubImageCubeCase	(m_context, "cube_rgb",				"",	GL_RGB,				GL_UNSIGNED_BYTE, MIPMAPS, 64, 64));
		copyTexSubImageGroup->addChild(new BasicCopyTexSubImageCubeCase	(m_context, "cube_rgba",			"",	GL_RGBA,			GL_UNSIGNED_BYTE, MIPMAPS, 64, 64));
	}
}